

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modelwriter.h
# Opt level: O2

int __thiscall
ModelWriter::fwrite_weight_tag_data(ModelWriter *this,Mat *data,FILE *bp,float a,float b)

{
  long lVar1;
  long lVar2;
  Mat local_100;
  uchar padding [4];
  uint uStack_b4;
  int tag;
  Option local_60;
  
  lVar1 = ftell((FILE *)bp);
  ncnn::Mat::reshape(&local_100,data,data->h * data->w * data->d * data->c,(Allocator *)0x0);
  if (this->gen_random_weight != 0) {
    Randomize(&local_100,a,b);
  }
  if (local_100.elemsize == 1) {
    _padding = (void *)CONCAT44(uStack_b4,0xd4b38);
LAB_0015bacc:
    fwrite(padding,4,1,(FILE *)bp);
  }
  else {
    if (local_100.elemsize == 2) {
      _padding = (void *)CONCAT44(uStack_b4,0x1306b47);
      goto LAB_0015bacc;
    }
    if (local_100.elemsize != 4) {
      fprintf(_stderr,"unknown weight data type %d\n");
      goto LAB_0015baf1;
    }
    if (this->storage_type == 1) {
      tag = 0x1306b47;
      fwrite(&tag,4,1,(FILE *)bp);
      _padding = (void *)0x0;
      ncnn::Option::Option(&local_60);
      ncnn::cast_float32_to_float16(&local_100,(Mat *)padding,&local_60);
      fwrite(_padding,0,0,(FILE *)bp);
      goto LAB_0015baf1;
    }
    _padding = (void *)((ulong)uStack_b4 << 0x20);
    fwrite(padding,4,1,(FILE *)bp);
    replace_denormals_with_zero((float *)local_100.data,(long)local_100.w);
  }
  fwrite(local_100.data,local_100.elemsize,(long)local_100.w,(FILE *)bp);
LAB_0015baf1:
  lVar2 = ftell((FILE *)bp);
  lVar1 = (long)((int)lVar2 - (int)lVar1);
  _padding = (void *)((ulong)_padding & 0xffffffff00000000);
  fwrite(padding,1,(lVar1 + 3U & 0xfffffffffffffffc) - lVar1,(FILE *)bp);
  if (local_100.refcount != (int *)0x0) {
    LOCK();
    *local_100.refcount = *local_100.refcount + -1;
    UNLOCK();
    if (*local_100.refcount == 0) {
      if (local_100.allocator == (Allocator *)0x0) {
        free(local_100.data);
      }
      else {
        (*(local_100.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  return 0;
}

Assistant:

int ModelWriter::fwrite_weight_tag_data(const ncnn::Mat& data, FILE* bp, float a, float b)
{
    int p0 = ftell(bp);

    ncnn::Mat data_flattened = data.reshape(data.w * data.h * data.d * data.c);
    if (gen_random_weight)
        Randomize(data_flattened, a, b);

    if (data_flattened.elemsize == 4)
    {
        if (storage_type == 1)
        {
            const int tag = 0x01306B47; // fp16 magic
            fwrite(&tag, sizeof(int), 1, bp);
            ncnn::Mat data_flattened_fp16;
            ncnn::cast_float32_to_float16(data_flattened, data_flattened_fp16);
            fwrite(data_flattened_fp16.data, data_flattened_fp16.elemsize, data_flattened_fp16.w, bp);
        }
        else
        {
            const int tag = 0; // fp32 magic
            fwrite(&tag, sizeof(int), 1, bp);
            replace_denormals_with_zero(data_flattened, data_flattened.w);
            fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);
        }
    }
    else if (data_flattened.elemsize == 2)
    {
        const int tag = 0x01306B47; // fp16 magic
        fwrite(&tag, sizeof(int), 1, bp);
        fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);
    }
    else if (data_flattened.elemsize == 1)
    {
        const int tag = 0x000D4B38; // int8 magic
        fwrite(&tag, sizeof(int), 1, bp);
        fwrite(data_flattened.data, data_flattened.elemsize, data_flattened.w, bp);
    }
    else
    {
        fprintf(stderr, "unknown weight data type %d\n", (int)data_flattened.elemsize);
    }

    // padding to 32bit align
    int nwrite = ftell(bp) - p0;
    size_t nalign = alignSize(nwrite, 4);
    unsigned char padding[4] = {0x00, 0x00, 0x00, 0x00};
    fwrite(padding, sizeof(unsigned char), nalign - nwrite, bp);

    return 0;
}